

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

int multi_getsock(Curl_easy *data,curl_socket_t *socks)

{
  connectdata *conn;
  _func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *UNRECOVERED_JUMPTABLE;
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  conn = data->conn;
  uVar1 = 0;
  uVar3 = 0;
  if (conn != (connectdata *)0x0) {
    uVar3 = uVar1;
    switch(data->mstate) {
    case MSTATE_RESOLVING:
      iVar2 = Curl_resolv_getsock(data,socks);
      return iVar2;
    case MSTATE_CONNECTING:
      if (((conn->http_proxy).proxytype == '\x02') && ((conn->bits).proxy_ssl_connected[0] == false)
         ) {
        iVar2 = (*Curl_ssl->getsock)(conn,socks);
        return iVar2;
      }
      if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
        iVar2 = Curl_SOCKS_getsock(conn,socks,0);
        return iVar2;
      }
      lVar4 = 0;
      uVar3 = 0;
      iVar2 = 0;
      do {
        if (conn->tempsock[lVar4] != -1) {
          socks[iVar2] = conn->tempsock[lVar4];
          uVar3 = uVar3 | 1 << (iVar2 + 0x10U & 0x1f);
          iVar2 = iVar2 + 1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      break;
    case MSTATE_TUNNELING:
      *socks = conn->sock[0];
      if (conn->connect_state == (http_connect_state *)0x0) {
        return 0x10000;
      }
      iVar2 = Curl_connect_getsock(conn);
      return iVar2;
    case MSTATE_PROTOCONNECT:
    case MSTATE_PROTOCONNECTING:
      UNRECOVERED_JUMPTABLE = conn->handler->proto_getsock;
      if (UNRECOVERED_JUMPTABLE == (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0)
      {
        *socks = conn->sock[0];
        return 0x10001;
      }
      iVar2 = (*UNRECOVERED_JUMPTABLE)(data,conn,socks);
      return iVar2;
    case MSTATE_DO:
    case MSTATE_DOING:
      UNRECOVERED_JUMPTABLE = conn->handler->doing_getsock;
      if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0)
      {
        iVar2 = (*UNRECOVERED_JUMPTABLE)(data,conn,socks);
        return iVar2;
      }
      break;
    case MSTATE_DOING_MORE:
      UNRECOVERED_JUMPTABLE = conn->handler->domore_getsock;
      if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0)
      {
        iVar2 = (*UNRECOVERED_JUMPTABLE)(data,conn,socks);
        return iVar2;
      }
      break;
    case MSTATE_DID:
    case MSTATE_PERFORMING:
      iVar2 = Curl_single_getsock(data,conn,socks);
      return iVar2;
    }
  }
  return uVar3;
}

Assistant:

static int multi_getsock(struct Curl_easy *data,
                         curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  /* The no connection case can happen when this is called from
     curl_multi_remove_handle() => singlesocket() => multi_getsock().
  */
  if(!conn)
    return 0;

  switch(data->mstate) {
  default:
    return 0;

  case MSTATE_RESOLVING:
    return Curl_resolv_getsock(data, socks);

  case MSTATE_PROTOCONNECTING:
  case MSTATE_PROTOCONNECT:
    return protocol_getsock(data, conn, socks);

  case MSTATE_DO:
  case MSTATE_DOING:
    return doing_getsock(data, conn, socks);

  case MSTATE_TUNNELING:
    return waitproxyconnect_getsock(conn, socks);

  case MSTATE_CONNECTING:
    return waitconnect_getsock(conn, socks);

  case MSTATE_DOING_MORE:
    return domore_getsock(data, conn, socks);

  case MSTATE_DID: /* since is set after DO is completed, we switch to
                        waiting for the same as the PERFORMING state */
  case MSTATE_PERFORMING:
    return Curl_single_getsock(data, conn, socks);
  }

}